

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameManager.cpp
# Opt level: O3

void __thiscall
myvk::FrameManager::initialize
          (FrameManager *this,Ptr<Queue> *graphics_queue,Ptr<PresentQueue> *present_queue,
          bool use_vsync,uint32_t frame_count,VkImageUsageFlags image_usage)

{
  Ptr<Swapchain> *swapchain;
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  pointer psVar4;
  pointer psVar5;
  pointer psVar6;
  ulong __new_size;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type __new_size_00;
  long lVar10;
  ulong uVar11;
  undefined1 local_88 [64];
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  local_48;
  
  __new_size = (ulong)frame_count;
  local_88._56_8_ = graphics_queue;
  Swapchain::Create((Swapchain *)local_88,graphics_queue,present_queue,use_vsync,image_usage);
  uVar8 = local_88._8_8_;
  uVar7 = local_88._0_8_;
  swapchain = &this->m_swapchain;
  local_88._0_8_ = (value_type)0x0;
  local_88._8_8_ = (element_type *)0x0;
  p_Var2 = (this->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar7;
  (this->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
     (element_type *)local_88._8_8_ != (element_type *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  SwapchainImage::Create(&local_48,swapchain);
  local_88._16_8_ =
       (this->m_swapchain_images).
       super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_swapchain_images).
  super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._0_8_ =
       (this->m_swapchain_images).
       super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88._8_8_ =
       (this->m_swapchain_images).
       super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_swapchain_images).
  super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_swapchain_images).
  super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ::~vector((vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
             *)local_88);
  std::
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ::~vector(&local_48);
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::resize(&this->m_swapchain_image_views,
           (ulong)((this->m_swapchain).
                   super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  m_image_count);
  if (((this->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_image_count == 0) {
    __new_size_00 = 0;
  }
  else {
    lVar10 = 0;
    uVar11 = 0;
    do {
      ImageView::Create((ImageView *)local_88,
                        (Ptr<SwapchainImage> *)
                        ((long)&(((this->m_swapchain_images).
                                  super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar10));
      uVar8 = local_88._8_8_;
      uVar7 = local_88._0_8_;
      psVar3 = (this->m_swapchain_image_views).
               super__Vector_base<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88._0_8_ = (value_type)0x0;
      local_88._8_8_ = (element_type *)0x0;
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)&(psVar3->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi + lVar10);
      puVar1 = (undefined8 *)
               ((long)&(psVar3->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + lVar10);
      *puVar1 = uVar7;
      puVar1[1] = uVar8;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      uVar11 = uVar11 + 1;
      __new_size_00 =
           (size_type)
           ((swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           m_image_count;
      lVar10 = lVar10 + 0x10;
    } while (uVar11 < __new_size_00);
  }
  this->m_frame_count = frame_count;
  local_88._0_8_ = (value_type)0x0;
  std::vector<const_myvk::Fence_*,_std::allocator<const_myvk::Fence_*>_>::resize
            (&this->m_image_fences,__new_size_00,(value_type *)local_88);
  local_88._48_8_ = &this->m_frame_fences;
  std::vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>::resize
            ((vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_> *
             )local_88._48_8_,__new_size);
  local_88._40_8_ = &this->m_render_done_semaphores;
  std::vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
  ::resize((vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
            *)local_88._40_8_,__new_size);
  local_88._32_8_ = &this->m_acquire_done_semaphores;
  std::vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
  ::resize((vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
            *)local_88._32_8_,__new_size);
  std::
  vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
  ::resize(&this->m_frame_command_buffers,__new_size);
  if (frame_count != 0) {
    lVar10 = 0;
    do {
      iVar9 = (*(((swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
      Fence::Create((Fence *)local_88,(Ptr<Device> *)CONCAT44(extraout_var,iVar9),1);
      uVar8 = local_88._8_8_;
      uVar7 = local_88._0_8_;
      psVar4 = (((_Vector_base<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
                  *)local_88._48_8_)->_M_impl).super__Vector_impl_data._M_start;
      local_88._0_8_ = (value_type)0x0;
      local_88._8_8_ = (element_type *)0x0;
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)&(psVar4->super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi + lVar10);
      puVar1 = (undefined8 *)
               ((long)&(psVar4->super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               + lVar10);
      *puVar1 = uVar7;
      puVar1[1] = uVar8;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      iVar9 = (*(((swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
      Semaphore::Create((Semaphore *)local_88,(Ptr<Device> *)CONCAT44(extraout_var_00,iVar9));
      uVar8 = local_88._8_8_;
      uVar7 = local_88._0_8_;
      psVar5 = ((_Vector_impl_data *)
               &(((Queue *)local_88._40_8_)->super_DeviceObjectBase).super_Base)->_M_start;
      local_88._0_8_ = (value_type)0x0;
      local_88._8_8_ = (element_type *)0x0;
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)&(psVar5->super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi + lVar10);
      puVar1 = (undefined8 *)
               ((long)&(psVar5->super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + lVar10);
      *puVar1 = uVar7;
      puVar1[1] = uVar8;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      iVar9 = (*(((swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
      Semaphore::Create((Semaphore *)local_88,(Ptr<Device> *)CONCAT44(extraout_var_01,iVar9));
      uVar8 = local_88._8_8_;
      uVar7 = local_88._0_8_;
      psVar5 = (((_Vector_base<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
                  *)local_88._32_8_)->_M_impl).super__Vector_impl_data._M_start;
      local_88._0_8_ = (value_type)0x0;
      local_88._8_8_ = (element_type *)0x0;
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)&(psVar5->super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi + lVar10);
      puVar1 = (undefined8 *)
               ((long)&(psVar5->super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + lVar10);
      *puVar1 = uVar7;
      puVar1[1] = uVar8;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      CommandPool::Create((CommandPool *)&local_48,(Ptr<Queue> *)local_88._56_8_,0);
      CommandBuffer::Create
                ((CommandBuffer *)local_88,(Ptr<CommandPool> *)&local_48,
                 VK_COMMAND_BUFFER_LEVEL_PRIMARY);
      uVar8 = local_88._8_8_;
      uVar7 = local_88._0_8_;
      psVar6 = (this->m_frame_command_buffers).
               super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88._0_8_ = (value_type)0x0;
      local_88._8_8_ = (element_type *)0x0;
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)&(psVar6->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi + lVar10);
      puVar1 = (undefined8 *)
               ((long)&(psVar6->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr + lVar10);
      *puVar1 = uVar7;
      puVar1[1] = uVar8;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      if ((element_type *)
          local_48.
          super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_48.
                   super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      lVar10 = lVar10 + 0x10;
    } while (__new_size << 4 != lVar10);
  }
  return;
}

Assistant:

void FrameManager::initialize(const Ptr<Queue> &graphics_queue, const Ptr<PresentQueue> &present_queue, bool use_vsync,
                              uint32_t frame_count, VkImageUsageFlags image_usage) {
	m_swapchain = myvk::Swapchain::Create(graphics_queue, present_queue, use_vsync, image_usage);
	m_swapchain_images = myvk::SwapchainImage::Create(m_swapchain);
	m_swapchain_image_views.resize(m_swapchain->GetImageCount());
	for (uint32_t i = 0; i < m_swapchain->GetImageCount(); ++i)
		m_swapchain_image_views[i] = myvk::ImageView::Create(m_swapchain_images[i]);

	m_frame_count = frame_count;
	m_image_fences.resize(m_swapchain->GetImageCount(), nullptr);

	m_frame_fences.resize(frame_count);
	m_render_done_semaphores.resize(frame_count);
	m_acquire_done_semaphores.resize(frame_count);
	m_frame_command_buffers.resize(frame_count);

	for (uint32_t i = 0; i < frame_count; ++i) {
		m_frame_fences[i] = Fence::Create(m_swapchain->GetDevicePtr(), VK_FENCE_CREATE_SIGNALED_BIT);
		m_render_done_semaphores[i] = Semaphore::Create(m_swapchain->GetDevicePtr());
		m_acquire_done_semaphores[i] = Semaphore::Create(m_swapchain->GetDevicePtr());
		m_frame_command_buffers[i] = myvk::CommandBuffer::Create(myvk::CommandPool::Create(graphics_queue));
	}
}